

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O0

void __thiscall
psy::C::Parser::DiagnosticsReporter::UnexpectedContinueOutsideLoop(DiagnosticsReporter *this)

{
  allocator<char> local_f1;
  string local_f0 [55];
  allocator<char> local_b9;
  string local_b8 [32];
  string local_98 [32];
  DiagnosticDescriptor local_78;
  DiagnosticsReporter *local_10;
  DiagnosticsReporter *this_local;
  
  local_10 = this;
  std::__cxx11::string::string(local_98,(string *)&ID_of_UnexpectedContinueOutsideLoop_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"[[continue outside iteration-statement]]",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,"`continue\' not within a loop",&local_f1);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_78,local_98,local_b8,local_f0,2,1);
  diagnoseOrDelayDiagnostic(this,&local_78);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_78);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_98);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::UnexpectedContinueOutsideLoop()
{
    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(ID_of_UnexpectedContinueOutsideLoop,
                                     "[[continue outside iteration-statement]]",
                                     "`continue' not within a loop",
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax));
}